

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,int multiplier,
                 x86Reg base,uint shift)

{
  x86Argument arg_00;
  CodeGenGenericContext *this;
  x86Argument local_88;
  undefined1 local_68 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_58;
  x86Reg local_50;
  x86Reg xStack_4c;
  undefined1 local_48 [8];
  x86Argument arg;
  uint local_20;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  arg.ptrNum = base;
  local_20 = multiplier;
  base_local = index;
  multiplier_local = size;
  index_local = op;
  _size_local = ctx;
  if ((ctx->skipTracking & 1U) == 0) {
    CodeGenGenericContext::RedirectAddressComputation
              (ctx,&base_local,(int *)&local_20,(x86Reg *)&arg.ptrNum,&shift);
    CodeGenGenericContext::ReadRegister(_size_local,arg.ptrNum);
    CodeGenGenericContext::ReadRegister(_size_local,base_local);
  }
  x86Argument::x86Argument
            ((x86Argument *)local_48,multiplier_local,base_local,local_20,arg.ptrNum,shift);
  CodeGenGenericContext::MemRead(_size_local,(x86Argument *)local_48);
  switch(index_local) {
  case rECX:
  case rEDX:
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x436,
                  "void EMIT_OP_RPTR(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  case rR15|rR9:
    if ((_size_local->skipTracking & 1U) == 0) {
      CodeGenGenericContext::KillUnreadRegisters(_size_local);
      CodeGenGenericContext::InvalidateState(_size_local);
    }
    break;
  case rR15|rR11:
  case 0x26:
  case 0x4e:
  case 0x55:
    local_68._0_8_ = local_48;
    local_68._8_8_ = arg._0_8_;
    local_58 = arg.field_1;
    local_50 = arg.ptrBase;
    xStack_4c = arg.ptrIndex;
    arg_00.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)arg._0_8_;
    arg_00._0_8_ = local_48;
    arg_00.ptrBase = arg.field_1._0_4_;
    arg_00.ptrIndex = arg.field_1._4_4_;
    arg_00.ptrMult = arg.ptrBase;
    arg_00.ptrNum = arg.ptrIndex;
    CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_00);
    this = _size_local;
    x86Argument::x86Argument(&local_88);
    CodeGenGenericContext::MemWrite(this,(x86Argument *)local_48,&local_88);
    break;
  case 0x22:
  case 0x52:
    CodeGenGenericContext::ReadAndModifyRegister(_size_local,rEAX);
    CodeGenGenericContext::ReadAndModifyRegister(_size_local,rEDX);
    CodeGenGenericContext::ReadRegister(_size_local,rEAX);
    CodeGenGenericContext::ReadRegister(_size_local,rEDX);
  }
  _size_local->x86Op->name = index_local;
  (_size_local->x86Op->argA).type = argPtr;
  (_size_local->x86Op->argA).field_1.num = multiplier_local;
  (_size_local->x86Op->argA).ptrIndex = base_local;
  (_size_local->x86Op->argA).ptrMult = local_20;
  (_size_local->x86Op->argA).ptrBase = arg.ptrNum;
  (_size_local->x86Op->argA).ptrNum = shift;
  (_size_local->x86Op->argB).type = argNone;
  _size_local->x86Op = _size_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	ctx.MemRead(arg);

	switch(op)
	{
	case o_push:
	case o_pop:
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.InvalidateAddressValue(arg);

		ctx.MemWrite(arg, x86Argument());
		break;
	case o_idiv:
	case o_idiv64:
		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_call:
		if(ctx.skipTracking)
			break;

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}